

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O0

opj_sparse_array_int32_t *
opj_sparse_array_int32_create
          (OPJ_UINT32 width,OPJ_UINT32 height,OPJ_UINT32 block_width,OPJ_UINT32 block_height)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 **ppOVar2;
  opj_sparse_array_int32_t *sa;
  OPJ_UINT32 block_height_local;
  OPJ_UINT32 block_width_local;
  OPJ_UINT32 height_local;
  OPJ_UINT32 width_local;
  
  if ((((width == 0) || (height == 0)) || (block_width == 0)) || (block_height == 0)) {
    _height_local = (opj_sparse_array_int32_t *)0x0;
  }
  else if (0xffffffff / (ulong)block_height >> 2 < (ulong)block_width) {
    _height_local = (opj_sparse_array_int32_t *)0x0;
  }
  else {
    _height_local = (opj_sparse_array_int32_t *)opj_calloc(1,0x20);
    _height_local->width = width;
    _height_local->height = height;
    _height_local->block_width = block_width;
    _height_local->block_height = block_height;
    OVar1 = opj_uint_ceildiv(width,block_width);
    _height_local->block_count_hor = OVar1;
    OVar1 = opj_uint_ceildiv(height,block_height);
    _height_local->block_count_ver = OVar1;
    if ((uint)(0xffffffff / (ulong)_height_local->block_count_ver) < _height_local->block_count_hor)
    {
      opj_free(_height_local);
      _height_local = (opj_sparse_array_int32_t *)0x0;
    }
    else {
      ppOVar2 = (OPJ_INT32 **)
                opj_calloc(8,(ulong)_height_local->block_count_hor *
                             (ulong)_height_local->block_count_ver);
      _height_local->data_blocks = ppOVar2;
      if (_height_local->data_blocks == (OPJ_INT32 **)0x0) {
        opj_free(_height_local);
        _height_local = (opj_sparse_array_int32_t *)0x0;
      }
    }
  }
  return _height_local;
}

Assistant:

opj_sparse_array_int32_t* opj_sparse_array_int32_create(OPJ_UINT32 width,
        OPJ_UINT32 height,
        OPJ_UINT32 block_width,
        OPJ_UINT32 block_height)
{
    opj_sparse_array_int32_t* sa;

    if (width == 0 || height == 0 || block_width == 0 || block_height == 0) {
        return NULL;
    }
    if (block_width > ((OPJ_UINT32)~0U) / block_height / sizeof(OPJ_INT32)) {
        return NULL;
    }

    sa = (opj_sparse_array_int32_t*) opj_calloc(1,
            sizeof(opj_sparse_array_int32_t));
    sa->width = width;
    sa->height = height;
    sa->block_width = block_width;
    sa->block_height = block_height;
    sa->block_count_hor = opj_uint_ceildiv(width, block_width);
    sa->block_count_ver = opj_uint_ceildiv(height, block_height);
    if (sa->block_count_hor > ((OPJ_UINT32)~0U) / sa->block_count_ver) {
        opj_free(sa);
        return NULL;
    }
    sa->data_blocks = (OPJ_INT32**) opj_calloc(sizeof(OPJ_INT32*),
                      (size_t) sa->block_count_hor * sa->block_count_ver);
    if (sa->data_blocks == NULL) {
        opj_free(sa);
        return NULL;
    }

    return sa;
}